

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

IO * __thiscall adios2::core::ADIOS::AtIO(ADIOS *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  iterator itIO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
  *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  allocator local_159;
  string local_158 [39];
  undefined1 local_131 [40];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
       ::find(in_stack_fffffffffffffe18,(key_type *)0x845355);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
       ::end(in_stack_fffffffffffffe18);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Core",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"ADIOS",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"AtIO",&local_a1);
    std::operator+((char *)in_stack_fffffffffffffe68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
                           *)0x8455f0);
    bVar1 = IO::IsDeclared(&ppVar2->second);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Core",&local_109);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_131 + 1),"ADIOS",(allocator *)__lhs);
      __rhs = &local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"AtIO",__rhs);
      std::operator+((char *)in_stack_fffffffffffffe68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      std::operator+(__lhs,(char *)__rhs);
      helper::Throw<std::invalid_argument>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe60);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::__cxx11::string::~string((string *)(local_131 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_131);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
                         *)0x845847);
  return &ppVar2->second;
}

Assistant:

IO &ADIOS::AtIO(const std::string name)
{
    auto itIO = m_IOs.find(name);

    if (itIO == m_IOs.end())
    {
        helper::Throw<std::invalid_argument>("Core", "ADIOS", "AtIO",
                                             "IO " + name + " being used is not declared");
    }
    else
    {
        if (!itIO->second.IsDeclared())
        {
            helper::Throw<std::invalid_argument>("Core", "ADIOS", "AtIO",
                                                 "IO " + name + " being used is not declared");
        }
    }

    return itIO->second;
}